

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

bool cmGlobalGenerator::IsReservedTarget(string *name)

{
  bool bVar1;
  int iVar2;
  string *name_local;
  
  if (IsReservedTarget(std::__cxx11::string_const&)::reservedTargets == '\0') {
    iVar2 = __cxa_guard_acquire(&IsReservedTarget(std::__cxx11::string_const&)::reservedTargets);
    if (iVar2 != 0) {
      IsReservedTarget::reservedTargets[0] = ::cm::operator____s("all",3);
      IsReservedTarget::reservedTargets[1] = ::cm::operator____s("ALL_BUILD",9);
      IsReservedTarget::reservedTargets[2] = ::cm::operator____s("help",4);
      IsReservedTarget::reservedTargets[3] = ::cm::operator____s("install",7);
      IsReservedTarget::reservedTargets[4] = ::cm::operator____s("INSTALL",7);
      IsReservedTarget::reservedTargets[5] = ::cm::operator____s("preinstall",10);
      IsReservedTarget::reservedTargets[6] = ::cm::operator____s("clean",5);
      IsReservedTarget::reservedTargets[7] = ::cm::operator____s("edit_cache",10);
      IsReservedTarget::reservedTargets[8] = ::cm::operator____s("rebuild_cache",0xd);
      IsReservedTarget::reservedTargets[9] = ::cm::operator____s("ZERO_CHECK",10);
      __cxa_guard_release(&IsReservedTarget(std::__cxx11::string_const&)::reservedTargets);
    }
  }
  bVar1 = ::cm::
          contains<cm::static_string_view[10],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                    (&IsReservedTarget::reservedTargets,name);
  return bVar1;
}

Assistant:

bool cmGlobalGenerator::IsReservedTarget(std::string const& name)
{
  // The following is a list of targets reserved
  // by one or more of the cmake generators.

  // Adding additional targets to this list will require a policy!
  static const cm::static_string_view reservedTargets[] = {
    "all"_s,           "ALL_BUILD"_s,  "help"_s,  "install"_s,
    "INSTALL"_s,       "preinstall"_s, "clean"_s, "edit_cache"_s,
    "rebuild_cache"_s, "ZERO_CHECK"_s
  };

  return cm::contains(reservedTargets, name);
}